

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
* __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::GetParts
          (pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
           *__return_storage_ptr__,SymbolCompare *this,SymbolEntry *entry)

{
  bool bVar1;
  StringPiece local_58;
  StringPiece local_48;
  StringPiece local_38;
  undefined1 local_28 [8];
  StringPiece package;
  SymbolEntry *entry_local;
  SymbolCompare *this_local;
  
  package.length_ = (size_type)entry;
  _local_28 = SymbolEntry::package(entry,this->index);
  bVar1 = stringpiece_internal::StringPiece::empty((StringPiece *)local_28);
  if (bVar1) {
    local_38 = SymbolEntry::symbol((SymbolEntry *)package.length_,this->index);
    stringpiece_internal::StringPiece::StringPiece(&local_48);
    std::
    pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
    ::
    pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece,_true>
              (__return_storage_ptr__,&local_38,&local_48);
  }
  else {
    local_58 = SymbolEntry::symbol((SymbolEntry *)package.length_,this->index);
    std::
    pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
    ::
    pair<google::protobuf::stringpiece_internal::StringPiece_&,_google::protobuf::stringpiece_internal::StringPiece,_true>
              (__return_storage_ptr__,(StringPiece *)local_28,&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<StringPiece, StringPiece> GetParts(
        const SymbolEntry& entry) const {
      auto package = entry.package(index);
      if (package.empty()) return {entry.symbol(index), StringPiece{}};
      return {package, entry.symbol(index)};
    }